

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O2

void do_cmd_wiz_collect_obj_mon_stats(command *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t simtype;
  wchar_t nsim;
  char s [80];
  
  _Var1 = stats_are_enabled();
  if (_Var1) {
    wVar2 = cmd_get_arg_number((command_conflict *)cmd,"quantity",&nsim);
    if (wVar2 != L'\0') {
      strnfmt(s,0x50,"%d",(ulong)(uint)do_cmd_wiz_collect_obj_mon_stats::default_nsim);
      _Var1 = get_string("Number of simulations: ",s,0x50);
      if (!_Var1) {
        return;
      }
      _Var1 = get_int_from_string(s,&nsim);
      if (nsim < L'\x01' || !_Var1) {
        return;
      }
      cmd_set_arg_number((command_conflict *)cmd,"quantity",nsim);
    }
    do_cmd_wiz_collect_obj_mon_stats::default_nsim = nsim;
    wVar2 = cmd_get_arg_choice((command_conflict *)cmd,"choice",&simtype);
    if (wVar2 != L'\0') {
      strnfmt(s,0x50,"%d",(ulong)(uint)do_cmd_wiz_collect_obj_mon_stats::default_simtype);
      _Var1 = get_string("Type of Sim: Diving (1) or Clearing (2) ",s,0x50);
      if (!_Var1) {
        return;
      }
      _Var1 = get_int_from_string(s,&simtype);
      if (1 < (uint)(simtype + L'\xffffffff') || !_Var1) {
        return;
      }
      if (simtype == L'\x02') {
        _Var1 = get_check("Regen randarts (warning SLOW)? ");
        wVar2 = simtype;
        if (_Var1) {
          simtype = L'\x03';
          wVar2 = L'\x03';
        }
      }
      else {
        wVar2 = L'\x01';
      }
      cmd_set_arg_choice((command_conflict *)cmd,"choice",wVar2);
    }
    do_cmd_wiz_collect_obj_mon_stats::default_simtype = (uint)(simtype != L'\x01') + L'\x01';
    stats_collect(nsim,simtype);
  }
  return;
}

Assistant:

void do_cmd_wiz_collect_obj_mon_stats(struct command *cmd)
{
	/* Record last-used values to be the default in next run. */
	static int default_nsim = 50;
	static int default_simtype = 1;
	int nsim, simtype;
	char s[80];

	if (!stats_are_enabled()) return;

	if (cmd_get_arg_number(cmd, "quantity", &nsim) != CMD_OK) {
		/* Set default. */
		strnfmt(s, sizeof(s), "%d", default_nsim);

		if (!get_string("Number of simulations: ", s, sizeof(s))) return;
		if (!get_int_from_string(s, &nsim) || nsim < 1) return;
		cmd_set_arg_number(cmd, "quantity", nsim);
	}
	default_nsim = nsim;

	if (cmd_get_arg_choice(cmd, "choice", &simtype) != CMD_OK) {
		/* Set default. */
		strnfmt(s, sizeof(s), "%d", default_simtype);

		if (!get_string("Type of Sim: Diving (1) or Clearing (2) ",
			s, sizeof(s))) return;
		if (!get_int_from_string(s, &simtype) || simtype < 1 ||
			simtype > 2) return;
		if (simtype == 2) {
			if (get_check("Regen randarts (warning SLOW)? ")) {
				simtype = 3;
			}
		}
		cmd_set_arg_choice(cmd, "choice", simtype);
	}
	default_simtype = (simtype == 1) ? 1 : 2;

	stats_collect(nsim, simtype);
}